

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_IgnoredRepeatedDeleteTest_Test::TestBody
          (ComparisonTest_IgnoredRepeatedDeleteTest_Test *this)

{
  RepeatedField<int> *pRVar1;
  byte *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Arena *arena;
  char *message;
  string_view value;
  AssertHelper local_60;
  string local_58;
  internal local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  
  pRVar1 = &(this->super_ComparisonTest).proto1diff_.field_0._impl_.rv_;
  RepeatedField<int>::Add(pRVar1,3);
  RepeatedField<int>::Add(pRVar1,4);
  RepeatedField<int>::Add(pRVar1,5);
  pRVar1 = &(this->super_ComparisonTest).proto2diff_.field_0._impl_.rv_;
  RepeatedField<int>::Add(pRVar1,3);
  RepeatedField<int>::Add(pRVar1,4);
  pbVar2 = (byte *)((long)&(this->super_ComparisonTest).proto2diff_.field_0 + 0x18);
  *pbVar2 = *pbVar2 | 1;
  arena = (Arena *)(this->super_ComparisonTest).proto2diff_.super_Message.super_MessageLite.
                   _internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  value._M_str = "foo";
  value._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set
            (&(this->super_ComparisonTest).proto2diff_.field_0._impl_.w_,value,arena);
  paVar3 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"rv","");
  std::__cxx11::string::_M_assign((string *)&(this->super_ComparisonTest).ignored_field_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar3) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_
            (&local_58,this,&(this->super_ComparisonTest).proto1diff_.super_Message,
             &(this->super_ComparisonTest).proto2diff_.super_Message);
  testing::internal::CmpHelperEQ<char[29],std::__cxx11::string>
            (local_38,"\"ignored: rv\\n\" \"added: w: \\\"foo\\\"\\n\"","RunDiff()",
             (char (*) [29])"ignored: rv\nadded: w: \"foo\"\n",&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar3) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xe32,message);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_58._M_dataplus._M_p + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  return;
}

Assistant:

TEST_F(ComparisonTest, IgnoredRepeatedDeleteTest) {
  proto1diff_.add_rv(3);
  proto1diff_.add_rv(4);
  proto1diff_.add_rv(5);

  proto2diff_.add_rv(3);
  proto2diff_.add_rv(4);

  proto2diff_.set_w("foo");

  ignore_field("rv");

  EXPECT_EQ(
      "ignored: rv\n"
      "added: w: \"foo\"\n",
      RunDiff());
}